

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::registerTimer(TCPSocket *this,int tt)

{
  _Atomic_word *p_Var1;
  int iVar2;
  sendContext *psVar3;
  _List_node_base *p_Var4;
  int iVar5;
  rep rVar6;
  TCPSocket *pTVar7;
  bool bVar8;
  undefined1 local_38 [24];
  shared_ptr<hwnet::TCPSocket> sp;
  
  if (tt == 1) {
    psVar3 = this->ptrSendlist->head;
    if (psVar3 == (sendContext *)0x0) {
      bVar8 = false;
      pTVar7 = this;
    }
    else {
      pTVar7 = (TCPSocket *)
               (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (pTVar7 != (TCPSocket *)0x0) {
        iVar5 = *(int *)&(pTVar7->super_Channel)._vptr_Channel;
        do {
          if (iVar5 == 0) {
            pTVar7 = (TCPSocket *)0x0;
            break;
          }
          LOCK();
          iVar2 = *(int *)&(pTVar7->super_Channel)._vptr_Channel;
          bVar8 = iVar5 == iVar2;
          if (bVar8) {
            *(int *)&(pTVar7->super_Channel)._vptr_Channel = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
        } while (!bVar8);
      }
      if (pTVar7 == (TCPSocket *)0x0) {
        bVar8 = true;
      }
      else {
        bVar8 = *(int *)&(pTVar7->super_Channel)._vptr_Channel == 0;
      }
      bVar8 = (bool)((this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr == (element_type *)0x0 | bVar8);
    }
    if (pTVar7 != (TCPSocket *)0x0 && psVar3 != (sendContext *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar7);
    }
    if (!bVar8) {
      return;
    }
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)(local_38 + 0x10),
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->lastSendTime).__d.__r = rVar6;
    util::TimerRoutine::
    addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
              ((TimerRoutine *)local_38,(milliseconds)&this->poller_->timerRoutine,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)
               (long)timoutResolution,(shared_ptr<hwnet::TCPSocket> *)onTimer);
  }
  else {
    p_Var4 = (this->recvList).
             super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->recvList) {
      bVar8 = false;
      pTVar7 = this;
    }
    else {
      pTVar7 = (TCPSocket *)
               (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (pTVar7 != (TCPSocket *)0x0) {
        iVar5 = *(int *)&(pTVar7->super_Channel)._vptr_Channel;
        do {
          if (iVar5 == 0) {
            pTVar7 = (TCPSocket *)0x0;
            break;
          }
          LOCK();
          iVar2 = *(int *)&(pTVar7->super_Channel)._vptr_Channel;
          bVar8 = iVar5 == iVar2;
          if (bVar8) {
            *(int *)&(pTVar7->super_Channel)._vptr_Channel = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
        } while (!bVar8);
      }
      if (pTVar7 == (TCPSocket *)0x0) {
        bVar8 = true;
      }
      else {
        bVar8 = *(int *)&(pTVar7->super_Channel)._vptr_Channel == 0;
      }
      bVar8 = (bool)((this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr == (element_type *)0x0 | bVar8);
    }
    if (pTVar7 != (TCPSocket *)0x0 && p_Var4 != (_List_node_base *)&this->recvList) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar7);
    }
    if (!bVar8) {
      return;
    }
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)(local_38 + 0x10),
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->lastRecvTime).__d.__r = rVar6;
    util::TimerRoutine::
    addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
              ((TimerRoutine *)local_38,(milliseconds)&this->poller_->timerRoutine,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)
               (long)timoutResolution,(shared_ptr<hwnet::TCPSocket> *)onTimer);
  }
  std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_38._8_8_ + 0xc);
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = *(_Atomic_word *)(local_38._8_8_ + 0xc);
      *(int *)(local_38._8_8_ + 0xc) = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(*(_func_int ***)local_38._8_8_)[3])();
    }
  }
  if (sp.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sp.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void TCPSocket::registerTimer(int tt) {
	if(tt == timerSend) {
		//send
		if(!this->ptrSendlist->empty() && !this->timer.lock()) {
			auto sp = shared_from_this();
			this->lastSendTime = std::chrono::steady_clock::now();
			this->timer = this->poller_->addTimer(timoutResolution,TCPSocket::onTimer,sp);
		}

	} else {
		//recv
		if(!this->recvListEmpty() && !this->timer.lock()) {	
			auto sp = shared_from_this();
			this->lastRecvTime = std::chrono::steady_clock::now();
			this->timer = this->poller_->addTimer(timoutResolution,TCPSocket::onTimer,sp);
		}
	}
}